

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

JavascriptString * __thiscall
Js::JavascriptString::ConcatDestructive_CompoundAppendChars
          (JavascriptString *this,JavascriptString *pstRight)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  charcount_t cVar4;
  charcount_t lenRight;
  undefined4 *puVar5;
  ScriptContext *scriptContext;
  JavascriptLibrary *library;
  CompoundString *this_00;
  char16_t *pcVar6;
  char16_t *local_40;
  CompoundString *cs;
  JavascriptString *pstRight_local;
  JavascriptString *this_local;
  
  if (pstRight == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x20e,"(pstRight)","pstRight");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  cVar4 = GetLength(this);
  if ((cVar4 != 0) && (cVar4 = GetLength(pstRight), cVar4 != 0)) {
    cVar4 = GetLength(this);
    bVar2 = CompoundString::ShouldAppendChars(cVar4);
    if (bVar2) goto LAB_01320dcd;
    cVar4 = GetLength(pstRight);
    bVar2 = CompoundString::ShouldAppendChars(cVar4);
    if (bVar2) goto LAB_01320dcd;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                              ,0x212,
                              "(GetLength() != 0 && pstRight->GetLength() != 0 && (CompoundString::ShouldAppendChars(GetLength()) || CompoundString::ShouldAppendChars(pstRight->GetLength())))"
                              ,
                              "GetLength() != 0 && pstRight->GetLength() != 0 && (CompoundString::ShouldAppendChars(GetLength()) || CompoundString::ShouldAppendChars(pstRight->GetLength()))"
                             );
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 0;
LAB_01320dcd:
  scriptContext = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
  cVar4 = GetLength(this);
  lenRight = GetLength(pstRight);
  StringProfiler::RecordConcatenation(scriptContext,cVar4,lenRight,ConcatType_CompoundString);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,StringConcatPhase);
  if (bVar2) {
    bVar2 = IsFinalized(pstRight);
    if (bVar2) {
      local_40 = GetString(pstRight);
    }
    else {
      local_40 = L"";
    }
    bVar3 = IsFinalized(pstRight);
    bVar2 = true;
    if (bVar3) {
      cVar4 = GetLength(pstRight);
      bVar2 = 8 < cVar4;
    }
    pcVar6 = L"";
    if (bVar2) {
      pcVar6 = L"...";
    }
    Output::Print(L"JavascriptString::ConcatDestructive(\"%.8s%s\") - creating CompoundString, appending chars\n"
                  ,local_40,pcVar6);
    Output::Flush();
  }
  library = RecyclableObject::GetLibrary(&this->super_RecyclableObject);
  this_00 = CompoundString::NewWithPointerCapacity(4,library);
  CompoundString::AppendChars(this_00,this);
  CompoundString::AppendChars(this_00,pstRight);
  return (JavascriptString *)this_00;
}

Assistant:

JavascriptString* JavascriptString::ConcatDestructive_CompoundAppendChars(JavascriptString* pstRight)
    {
        Assert(pstRight);
        Assert(
            GetLength() != 0 &&
            pstRight->GetLength() != 0 &&
            (CompoundString::ShouldAppendChars(GetLength()) || CompoundString::ShouldAppendChars(pstRight->GetLength())));

#ifdef PROFILE_STRINGS
        StringProfiler::RecordConcatenation(GetScriptContext(), GetLength(), pstRight->GetLength(), ConcatType_CompoundString);
#endif
        if(PHASE_TRACE_StringConcat)
        {
            Output::Print(
                _u("JavascriptString::ConcatDestructive(\"%.8s%s\") - creating CompoundString, appending chars\n"),
                pstRight->IsFinalized() ? pstRight->GetString() : _u(""),
                !pstRight->IsFinalized() || pstRight->GetLength() > 8 ? _u("...") : _u(""));
            Output::Flush();
        }

        CompoundString *const cs = CompoundString::NewWithPointerCapacity(4, GetLibrary());
        cs->AppendChars(this);
        cs->AppendChars(pstRight);
        return cs;
    }